

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O3

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::ChangeColumnTypeInfo::Copy(ChangeColumnTypeInfo *this)

{
  pointer pPVar1;
  AlterInfo *in_RSI;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_80;
  AlterEntryData local_78;
  
  AlterInfo::GetAlterEntryData(&local_78,in_RSI);
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)&in_RSI[1].schema._M_string_length);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_80,pPVar1);
  make_uniq_base<duckdb::AlterInfo,duckdb::ChangeColumnTypeInfo,duckdb::AlterEntryData,std::__cxx11::string_const&,duckdb::LogicalType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((duckdb *)this,&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1),
             (LogicalType *)&in_RSI[1].catalog.field_2,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_80);
  if (local_80._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
    operator_delete(local_78.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.schema._M_dataplus._M_p != &local_78.schema.field_2) {
    operator_delete(local_78.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.catalog._M_dataplus._M_p != &local_78.catalog.field_2) {
    operator_delete(local_78.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> ChangeColumnTypeInfo::Copy() const {
	return make_uniq_base<AlterInfo, ChangeColumnTypeInfo>(GetAlterEntryData(), column_name, target_type,
	                                                       expression->Copy());
}